

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.cpp
# Opt level: O2

void * boost::(anonymous_namespace)::thread_proxy(void *param)

{
  type ptVar1;
  thread_data_ptr thread_info;
  lock_guard<boost::mutex> lock;
  shared_ptr<boost::detail::thread_data_base> local_20;
  lock_guard<boost::mutex> local_10;
  
  enable_shared_from_this<boost::detail::thread_data_base>::shared_from_this
            ((enable_shared_from_this<boost::detail::thread_data_base> *)&local_20);
  ptVar1 = shared_ptr<boost::detail::thread_data_base>::operator->(&local_20);
  shared_ptr<boost::detail::thread_data_base>::reset(&ptVar1->self);
  detail::set_current_thread_data(local_20.px);
  ptVar1 = shared_ptr<boost::detail::thread_data_base>::operator->(&local_20);
  (*ptVar1->_vptr_thread_data_base[2])(ptVar1);
  detail::(anonymous_namespace)::tls_destructor(local_20.px);
  detail::set_current_thread_data((thread_data_base *)0x0);
  ptVar1 = shared_ptr<boost::detail::thread_data_base>::operator->(&local_20);
  local_10.m = &ptVar1->data_mutex;
  mutex::lock(local_10.m);
  ptVar1 = shared_ptr<boost::detail::thread_data_base>::operator->(&local_20);
  ptVar1->done = true;
  ptVar1 = shared_ptr<boost::detail::thread_data_base>::operator->(&local_20);
  condition_variable::notify_all(&ptVar1->done_condition);
  lock_guard<boost::mutex>::~lock_guard(&local_10);
  detail::shared_count::~shared_count(&local_20.pn);
  return (void *)0x0;
}

Assistant:

static void* thread_proxy(void* param)
            {
                //boost::detail::thread_data_ptr thread_info = static_cast<boost::detail::thread_data_base*>(param)->self;
                boost::detail::thread_data_ptr thread_info = static_cast<boost::detail::thread_data_base*>(param)->shared_from_this();
                thread_info->self.reset();
                detail::set_current_thread_data(thread_info.get());
#if defined BOOST_THREAD_PROVIDES_INTERRUPTIONS
                BOOST_TRY
                {
#endif
                    thread_info->run();
#if defined BOOST_THREAD_PROVIDES_INTERRUPTIONS

                }
                BOOST_CATCH (thread_interrupted const&)
                {
                }
// Removed as it stops the debugger identifying the cause of the exception
// Unhandled exceptions still cause the application to terminate
//                 BOOST_CATCH(...)
//                 {
//                   throw;
//
//                     std::terminate();
//                 }
                BOOST_CATCH_END
#endif
                detail::tls_destructor(thread_info.get());
                detail::set_current_thread_data(0);
                boost::lock_guard<boost::mutex> lock(thread_info->data_mutex);
                thread_info->done=true;
                thread_info->done_condition.notify_all();

                return 0;
            }